

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O1

void soplex::
     SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ::computeEquiExpVec(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *vecset,DataArray<int> *coScaleExp,DataArray<int> *scaleExp,
                        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *epsilon)

{
  Item *pIVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  double __x;
  DataArray<int> *pDVar3;
  uint uVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  undefined4 *puVar10;
  uint *puVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  uint *puVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  soplex *psVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  char cVar17;
  long lVar18;
  long lVar19;
  byte bVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_3e8;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_360;
  DataArray<int> *local_358;
  long local_350;
  DataArray<int> *local_348;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  cpp_dec_float<200U,_int,_void> local_338;
  cpp_dec_float<200U,_int,_void> local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_230;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  soplex local_b0 [112];
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar20 = 0;
  if (0 < (vecset->set).thenum) {
    local_350 = 0;
    local_360 = vecset;
    local_358 = scaleExp;
    local_348 = coScaleExp;
    local_340 = epsilon;
    do {
      pIVar1 = (local_360->set).theitem;
      iVar8 = (local_360->set).thekey[local_350].idx;
      local_338.fpclass = cpp_dec_float_finite;
      local_338.prec_elem = 0x1c;
      local_338.data._M_elems[0] = 0;
      local_338.data._M_elems[1] = 0;
      local_338.data._M_elems[2] = 0;
      local_338.data._M_elems[3] = 0;
      local_338.data._M_elems[4] = 0;
      local_338.data._M_elems[5] = 0;
      local_338.data._M_elems[6] = 0;
      local_338.data._M_elems[7] = 0;
      local_338.data._M_elems[8] = 0;
      local_338.data._M_elems[9] = 0;
      local_338.data._M_elems[10] = 0;
      local_338.data._M_elems[0xb] = 0;
      local_338.data._M_elems[0xc] = 0;
      local_338.data._M_elems[0xd] = 0;
      local_338.data._M_elems[0xe] = 0;
      local_338.data._M_elems[0xf] = 0;
      local_338.data._M_elems[0x10] = 0;
      local_338.data._M_elems[0x11] = 0;
      local_338.data._M_elems[0x12] = 0;
      local_338.data._M_elems[0x13] = 0;
      local_338.data._M_elems[0x14] = 0;
      local_338.data._M_elems[0x15] = 0;
      local_338.data._M_elems[0x16] = 0;
      local_338.data._M_elems[0x17] = 0;
      local_338.data._M_elems[0x18] = 0;
      local_338.data._M_elems[0x19] = 0;
      local_338.data._M_elems._104_5_ = 0;
      local_338.data._M_elems[0x1b]._1_3_ = 0;
      local_338.exp = 0;
      local_338.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_338,0.0);
      if (0 < pIVar1[iVar8].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar1 = pIVar1 + iVar8;
        lVar19 = 0;
        lVar18 = 0;
        do {
          pNVar2 = (pIVar1->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar10 = (undefined4 *)((long)&(pNVar2->val).m_backend.data + lVar19);
          psVar15 = local_b0;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *(undefined4 *)psVar15 = *puVar10;
            puVar10 = puVar10 + (ulong)bVar20 * -2 + 1;
            psVar15 = psVar15 + (ulong)bVar20 * -8 + 4;
          }
          local_40 = *(undefined4 *)((long)&(pNVar2->val).m_backend.data + lVar19 + 0x70);
          local_3c = *(undefined1 *)((long)&(pNVar2->val).m_backend.data + lVar19 + 0x74);
          local_38 = *(undefined8 *)((long)&(pNVar2->val).m_backend.data + lVar19 + 0x78);
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                    (&local_230,local_b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)(uint)local_348->data
                                     [*(int *)((long)(&((pIVar1->data).
                                                                                                                
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar19)],(int)local_348->data
                    );
          iVar6 = local_230.m_backend.prec_elem;
          fVar5 = local_230.m_backend.fpclass;
          iVar8 = local_230.m_backend.exp;
          uVar4 = local_230.m_backend.data._M_elems[0];
          cVar17 = local_230.m_backend.neg;
          if (local_230.m_backend.neg == true) {
            cVar17 = local_230.m_backend.fpclass == cpp_dec_float_finite &&
                     local_230.m_backend.data._M_elems[0] == 0;
          }
          puVar13 = local_230.m_backend.data._M_elems + 1;
          puVar11 = puVar13;
          pcVar14 = &local_2b8;
          for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar14->data)._M_elems[0] = *puVar11;
            puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar20 * -8 + 4);
          }
          pcVar14 = &local_338;
          pcVar16 = &local_130;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar16->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar20 * -8 + 4);
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar20 * -8 + 4);
          }
          local_130.exp = local_338.exp;
          local_130.neg = local_338.neg;
          local_130.fpclass = local_338.fpclass;
          local_130.prec_elem = local_338.prec_elem;
          pnVar12 = local_340;
          pcVar14 = &local_1b0;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar14->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar20 * -2 + 1) * 4);
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar14 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          local_1b0.exp = (local_340->m_backend).exp;
          local_1b0.neg = (local_340->m_backend).neg;
          local_1b0.fpclass = (local_340->m_backend).fpclass;
          local_1b0.prec_elem = (local_340->m_backend).prec_elem;
          local_3e8.data._M_elems[2] = 0;
          local_3e8.data._M_elems[3] = 0;
          local_3e8.data._M_elems[4] = 0;
          local_3e8.data._M_elems[5] = 0;
          local_3e8.data._M_elems[6] = 0;
          local_3e8.data._M_elems[7] = 0;
          local_3e8.data._M_elems[8] = 0;
          local_3e8.data._M_elems[9] = 0;
          local_3e8.data._M_elems[10] = 0;
          local_3e8.data._M_elems[0xb] = 0;
          local_3e8.data._M_elems[0xc] = 0;
          local_3e8.data._M_elems[0xd] = 0;
          local_3e8.data._M_elems[0xe] = 0;
          local_3e8.data._M_elems[0xf] = 0;
          local_3e8.data._M_elems[0x10] = 0;
          local_3e8.data._M_elems[0x11] = 0;
          local_3e8.data._M_elems[0x12] = 0;
          local_3e8.data._M_elems[0x13] = 0;
          local_3e8.data._M_elems[0x14] = 0;
          local_3e8.data._M_elems[0x15] = 0;
          local_3e8.data._M_elems[0x16] = 0;
          local_3e8.data._M_elems[0x17] = 0;
          local_3e8.data._M_elems[0x18] = 0;
          local_3e8.data._M_elems[0x19] = 0;
          local_3e8.data._M_elems._104_5_ = 0;
          local_3e8.data._M_elems[0x1b]._1_3_ = 0;
          local_3e8.data._M_elems[1] = 0;
          local_3e8.data._M_elems[0] = uVar4;
          puVar11 = local_3e8.data._M_elems + 1;
          for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar11 = *puVar13;
            puVar13 = puVar13 + (ulong)bVar20 * -2 + 1;
            puVar11 = puVar11 + (ulong)bVar20 * -2 + 1;
          }
          local_3e8.exp = iVar8;
          local_3e8.prec_elem = iVar6;
          local_3e8.fpclass = fVar5;
          local_3e8.neg = (bool)cVar17;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_3e8,&local_130);
          if (((local_3e8.fpclass != cpp_dec_float_NaN) && (local_1b0.fpclass != cpp_dec_float_NaN))
             && (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_3e8,&local_1b0), 0 < iVar7)) {
            local_338.data._M_elems[0] = uVar4;
            pcVar14 = &local_2b8;
            puVar13 = local_338.data._M_elems + 1;
            for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar13 = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar20 * -8 + 4);
              puVar13 = puVar13 + (ulong)bVar20 * -2 + 1;
            }
            local_338.exp = iVar8;
            local_338.prec_elem = iVar6;
            local_338.fpclass = fVar5;
            local_338.neg = (bool)cVar17;
          }
          lVar18 = lVar18 + 1;
          lVar19 = lVar19 + 0x84;
        } while (lVar18 < (pIVar1->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      if (local_338.fpclass != cpp_dec_float_NaN) {
        local_3e8.fpclass = cpp_dec_float_finite;
        local_3e8.prec_elem = 0x1c;
        local_3e8.data._M_elems[0] = 0;
        local_3e8.data._M_elems[1] = 0;
        local_3e8.data._M_elems[2] = 0;
        local_3e8.data._M_elems[3] = 0;
        local_3e8.data._M_elems[4] = 0;
        local_3e8.data._M_elems[5] = 0;
        local_3e8.data._M_elems[6] = 0;
        local_3e8.data._M_elems[7] = 0;
        local_3e8.data._M_elems[8] = 0;
        local_3e8.data._M_elems[9] = 0;
        local_3e8.data._M_elems[10] = 0;
        local_3e8.data._M_elems[0xb] = 0;
        local_3e8.data._M_elems[0xc] = 0;
        local_3e8.data._M_elems[0xd] = 0;
        local_3e8.data._M_elems[0xe] = 0;
        local_3e8.data._M_elems[0xf] = 0;
        local_3e8.data._M_elems[0x10] = 0;
        local_3e8.data._M_elems[0x11] = 0;
        local_3e8.data._M_elems[0x12] = 0;
        local_3e8.data._M_elems[0x13] = 0;
        local_3e8.data._M_elems[0x14] = 0;
        local_3e8.data._M_elems[0x15] = 0;
        local_3e8.data._M_elems[0x16] = 0;
        local_3e8.data._M_elems[0x17] = 0;
        local_3e8.data._M_elems[0x18] = 0;
        local_3e8.data._M_elems[0x19] = 0;
        local_3e8.data._M_elems._104_5_ = 0;
        local_3e8.data._M_elems[0x1b]._1_3_ = 0;
        local_3e8.exp = 0;
        local_3e8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_3e8,0.0);
        iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_338,&local_3e8);
        if (iVar8 == 0) {
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_338,1.0);
        }
      }
      local_2b8.fpclass = cpp_dec_float_finite;
      local_2b8.prec_elem = 0x1c;
      local_2b8.data._M_elems[0] = 0;
      local_2b8.data._M_elems[1] = 0;
      local_2b8.data._M_elems[2] = 0;
      local_2b8.data._M_elems[3] = 0;
      local_2b8.data._M_elems[4] = 0;
      local_2b8.data._M_elems[5] = 0;
      local_2b8.data._M_elems[6] = 0;
      local_2b8.data._M_elems[7] = 0;
      local_2b8.data._M_elems[8] = 0;
      local_2b8.data._M_elems[9] = 0;
      local_2b8.data._M_elems[10] = 0;
      local_2b8.data._M_elems[0xb] = 0;
      local_2b8.data._M_elems[0xc] = 0;
      local_2b8.data._M_elems[0xd] = 0;
      local_2b8.data._M_elems[0xe] = 0;
      local_2b8.data._M_elems[0xf] = 0;
      local_2b8.data._M_elems[0x10] = 0;
      local_2b8.data._M_elems[0x11] = 0;
      local_2b8.data._M_elems[0x12] = 0;
      local_2b8.data._M_elems[0x13] = 0;
      local_2b8.data._M_elems[0x14] = 0;
      local_2b8.data._M_elems[0x15] = 0;
      local_2b8.data._M_elems[0x16] = 0;
      local_2b8.data._M_elems[0x17] = 0;
      local_2b8.data._M_elems[0x18] = 0;
      local_2b8.data._M_elems[0x19] = 0;
      local_2b8.data._M_elems._104_5_ = 0;
      local_2b8.data._M_elems[0x1b]._1_3_ = 0;
      local_2b8.exp = 0;
      local_2b8.neg = false;
      local_3e8.fpclass = cpp_dec_float_finite;
      local_3e8.prec_elem = 0x1c;
      local_3e8.data._M_elems[0] = 0;
      local_3e8.data._M_elems[1] = 0;
      local_3e8.data._M_elems[2] = 0;
      local_3e8.data._M_elems[3] = 0;
      local_3e8.data._M_elems[4] = 0;
      local_3e8.data._M_elems[5] = 0;
      local_3e8.data._M_elems[6] = 0;
      local_3e8.data._M_elems[7] = 0;
      local_3e8.data._M_elems[8] = 0;
      local_3e8.data._M_elems[9] = 0;
      local_3e8.data._M_elems[10] = 0;
      local_3e8.data._M_elems[0xb] = 0;
      local_3e8.data._M_elems[0xc] = 0;
      local_3e8.data._M_elems[0xd] = 0;
      local_3e8.data._M_elems[0xe] = 0;
      local_3e8.data._M_elems[0xf] = 0;
      local_3e8.data._M_elems[0x10] = 0;
      local_3e8.data._M_elems[0x11] = 0;
      local_3e8.data._M_elems[0x12] = 0;
      local_3e8.data._M_elems[0x13] = 0;
      local_3e8.data._M_elems[0x14] = 0;
      local_3e8.data._M_elems[0x15] = 0;
      local_3e8.data._M_elems[0x16] = 0;
      local_3e8.data._M_elems[0x17] = 0;
      local_3e8.data._M_elems[0x18] = 0;
      local_3e8.data._M_elems[0x19] = 0;
      local_3e8.data._M_elems._104_5_ = 0;
      local_3e8.data._M_elems[0x1b]._1_3_ = 0;
      local_3e8.exp = 0;
      local_3e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_3e8,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_2b8,&local_3e8,&local_338);
      __x = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                      (&local_2b8);
      lVar18 = local_350;
      pDVar3 = local_358;
      frexp(__x,local_358->data + local_350);
      pDVar3->data[lVar18] = pDVar3->data[lVar18] + -1;
      local_350 = lVar18 + 1;
    } while (local_350 < (local_360->set).thenum);
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::computeEquiExpVec(const SVSetBase<R>* vecset, const DataArray<int>& coScaleExp,
                                       DataArray<int>& scaleExp, R epsilon)
{
   assert(vecset != nullptr);

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(spxLdexp(vec.value(j), coScaleExp[vec.index(j)]));

         if(GT(x, maxi, epsilon))
            maxi = x;
      }

      // empty rows/cols are possible
      if(maxi == 0.0)
         maxi = 1.0;

      assert(maxi > 0.0);

      spxFrexp(Real(1.0 / maxi), &(scaleExp[i]));

      scaleExp[i] -= 1;
   }
}